

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall cs::struct_builder::~struct_builder(struct_builder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&(this->mMethod).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  tree_type<cs::token_base_*>::destroy((this->mParent).mRoot);
  pcVar2 = (this->mName)._M_dataplus._M_p;
  paVar1 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~struct_builder() = default;